

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMallocTrace.cpp
# Opt level: O2

void copymaps(char *filepath)

{
  FILE *__stream;
  FILE *__stream_00;
  size_t __size;
  char mapfile [16];
  char newmapfile [256];
  char buffer [256];
  
  builtin_strncpy(mapfile,"/proc/self/maps",0x10);
  snprintf(newmapfile,0x100,"%s.maps",filepath);
  __stream = fopen(mapfile,"r");
  if (__stream != (FILE *)0x0) {
    __stream_00 = fopen(newmapfile,"w");
    if (__stream_00 != (FILE *)0x0) {
      while( true ) {
        __size = fread(buffer,1,0x100,__stream);
        if (__size == 0) break;
        fwrite(buffer,__size,1,__stream_00);
      }
      fclose(__stream_00);
    }
    fclose(__stream);
  }
  printf("Copy %s to %s\n",mapfile,newmapfile);
  puts("Please use below command and try to find the memory leak line in your source file");
  printf("smtaddr2line.sh %s %s %s\n",filepath,newmapfile,
         "/ #one specific directory that contains current current process\'s excutable binary and linked shared libraies"
        );
  return;
}

Assistant:

void copymaps(char* filepath)
{
    char mapfile[] = "/proc/self/maps";
    char newmapfile[PATH_MAX];
    snprintf(newmapfile, sizeof(newmapfile), "%s.maps", filepath);
    FILE* rf = fopen(mapfile, "r");
    if (rf) {
        FILE* wf = fopen(newmapfile, "w");
        if (wf) {
            char buffer[256];
            size_t rsz;
            while (rsz = fread(buffer, 1, sizeof(buffer), rf))
                fwrite(buffer, rsz, 1, wf);
            fclose(wf);
        }
        fclose(rf);
    }
    SMTLOG("Copy %s to %s\n", mapfile, newmapfile);
    SMTLOG("Please use below command and try to find the memory leak line in your source file\n");
    SMTLOG("smtaddr2line.sh %s %s %s\n", filepath, newmapfile, "/ #one specific directory that contains current current process's excutable binary and linked shared libraies");
}